

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::keyPressEvent(QTreeView *this,QKeyEvent *event)

{
  bool bVar1;
  int iVar2;
  QTreeViewPrivate *index;
  QAbstractItemViewPrivate *in_RSI;
  long in_FS_OFFSET;
  QModelIndex *unaff_retaddr;
  QTreeView *in_stack_00000008;
  QTreeViewPrivate *d;
  QModelIndex current;
  QKeyEvent *in_stack_00000058;
  QAbstractItemView *in_stack_00000060;
  QModelIndex *index_00;
  QTreeView *this_00;
  QModelIndex *index_01;
  
  index_01 = *(QModelIndex **)(in_FS_OFFSET + 0x28);
  index = d_func((QTreeView *)0x8f9bbf);
  index_00 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QTreeView *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QAbstractItemView *)in_RSI);
  bVar1 = QAbstractItemViewPrivate::isIndexValid(in_RSI,(QModelIndex *)index);
  if (((bVar1) && ((index->super_QAbstractItemViewPrivate).model != (QAbstractItemModel *)0x0)) &&
     ((index->itemsExpandable & 1U) != 0)) {
    iVar2 = QKeyEvent::key((QKeyEvent *)in_RSI);
    if (iVar2 == 0x2a) {
      expandRecursively((QTreeView *)unaff_retaddr,index_01,(int)((ulong)this_00 >> 0x20));
    }
    else if (iVar2 == 0x2b) {
      expand(this_00,index_00);
    }
    else if (iVar2 == 0x2d) {
      collapse(in_stack_00000008,unaff_retaddr);
    }
  }
  QAbstractItemView::keyPressEvent(in_stack_00000060,in_stack_00000058);
  if (*(QModelIndex **)(in_FS_OFFSET + 0x28) != index_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::keyPressEvent(QKeyEvent *event)
{
    Q_D(QTreeView);
    QModelIndex current = currentIndex();
    //this is the management of the expansion
    if (d->isIndexValid(current) && d->model && d->itemsExpandable) {
        switch (event->key()) {
        case Qt::Key_Asterisk: {
            expandRecursively(current);
            break; }
        case Qt::Key_Plus:
            expand(current);
            break;
        case Qt::Key_Minus:
            collapse(current);
            break;
        }
    }

    QAbstractItemView::keyPressEvent(event);
}